

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# views_pool.cpp
# Opt level: O2

void __thiscall cppcms::views::manager::data::data(data *this)

{
  this->auto_reload = false;
  (this->default_skin)._M_dataplus._M_p = (pointer)&(this->default_skin).field_2;
  (this->default_skin)._M_string_length = 0;
  (this->default_skin).field_2._M_local_buf[0] = '\0';
  (this->skins).
  super__Vector_base<cppcms::views::impl::skin,_std::allocator<cppcms::views::impl::skin>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->skins).
  super__Vector_base<cppcms::views::impl::skin,_std::allocator<cppcms::views::impl::skin>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->skins).
  super__Vector_base<cppcms::views::impl::skin,_std::allocator<cppcms::views::impl::skin>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  booster::recursive_shared_mutex::recursive_shared_mutex(&this->lock);
  return;
}

Assistant:

data() : auto_reload(false) 
	{
	}